

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Float pbrt::SampleSmoothStep(Float u,Float a,Float b)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 in_register_00001244 [60];
  undefined1 auVar3 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar4 [64];
  anon_class_12_3_4e9287b8 f;
  
  auVar4._4_60_ = in_register_00001284;
  auVar4._0_4_ = b;
  auVar3._4_60_ = in_register_00001244;
  auVar3._0_4_ = a;
  auVar1 = vinsertps_avx(auVar3._0_16_,auVar4._0_16_,0x10);
  f._0_8_ = auVar1._0_8_;
  f.u = u;
  fVar2 = NewtonBisection<float,pbrt::SampleSmoothStep(float,float,float)::_lambda(float)_1_>
                    (a,b,f,1e-06,1e-06,(enable_if_t<std::is_floating_point<float>::value> *)0x0);
  return fVar2;
}

Assistant:

PBRT_CPU_GPU
inline Float SampleSmoothStep(Float u, Float a, Float b) {
    DCHECK_LT(a, b);
    auto cdfMinusU = [=](Float x) -> std::pair<Float, Float> {
        Float t = (x - a) / (b - a);
        Float P = 2 * Pow<3>(t) - Pow<4>(t);
        Float PDeriv = SmoothStepPDF(x, a, b);
        return {P - u, PDeriv};
    };
    return NewtonBisection(a, b, cdfMinusU);
}